

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::PrepareZ
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *y,
          TPZFMatrix<std::complex<long_double>_> *z,complex<long_double> beta,int opt)

{
  long lVar1;
  longdouble lVar2;
  complex<long_double> *pcVar3;
  size_t sVar4;
  long col;
  long lVar5;
  long lVar6;
  int64_t i;
  long row;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar6 = (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(z,lVar1,lVar6);
  col = 0;
  lVar5 = lVar1;
  if (lVar1 < 1) {
    lVar5 = col;
  }
  if (lVar6 < 1) {
    lVar6 = col;
  }
  for (; col != lVar6; col = col + 1) {
    pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()(z,0,col);
    lVar2 = (longdouble)0;
    if ((((longdouble)beta._M_value._0_10_ != lVar2) || ((longdouble)beta._M_value._16_10_ != lVar2)
        ) || (sVar4 = lVar1 << 5, NAN((longdouble)beta._M_value._16_10_) || NAN(lVar2))) {
      if (z != y) {
        memcpy(pcVar3,y->fElem +
                      (y->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow *
                      col,lVar1 << 5);
      }
      for (row = 0; lVar5 != row; row = row + 1) {
        pcVar3 = TPZFMatrix<std::complex<long_double>_>::operator()(z,row,col);
        std::complex<long_double>::operator*=(pcVar3,&beta);
      }
    }
    else {
      for (; sVar4 != 0; sVar4 = sVar4 - 0x20) {
        *(longdouble *)pcVar3->_M_value = lVar2;
        *(longdouble *)(pcVar3->_M_value + 0x10) = lVar2;
        pcVar3 = pcVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}